

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regerror.c
# Opt level: O2

size_t set_result(char *errbuf,size_t errbuf_size,char *result)

{
  size_t sVar1;
  size_t __n;
  
  sVar1 = strlen(result);
  if (errbuf_size != 0) {
    __n = errbuf_size - 1;
    if (sVar1 < errbuf_size) {
      __n = sVar1;
    }
    memcpy(errbuf,result,__n);
    errbuf[__n] = '\0';
  }
  return sVar1 + 1;
}

Assistant:

static size_t
set_result(char *errbuf, size_t errbuf_size, char *result) {
	size_t result_len = strlen(result);
	if (errbuf_size > 0) {
		size_t copy_len = result_len < errbuf_size ? result_len : errbuf_size - 1;
		memcpy(errbuf, result, copy_len);
		errbuf[copy_len] = '\0';
	}
	return result_len + 1;
}